

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_SingleStringInTwoParts_Test::LineSplitter_SingleStringInTwoParts_Test
          (LineSplitter_SingleStringInTwoParts_Test *this)

{
  LineSplitter_SingleStringInTwoParts_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__LineSplitter_SingleStringInTwoParts_Test_002ec050;
  return;
}

Assistant:

TEST (LineSplitter, SingleStringInTwoParts) {
    using namespace pstore::dump;

    array::container container;
    line_splitter ls (&container);
    ls.append ("he"s);
    ls.append ("llo\n"s);

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello");
}